

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void I400ToARGBRow_SSE2(uint8_t *y_buf,uint8_t *dst_argb,YuvConstants *yuvconstants,int width)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  char cVar5;
  short sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [14];
  undefined1 auVar16 [12];
  unkbyte10 Var17;
  unkbyte9 Var18;
  undefined6 uVar19;
  undefined4 uVar20;
  undefined2 uVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar39 [16];
  int width_local;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 uVar37;
  undefined2 uVar38;
  
  auVar2 = *(undefined1 (*) [16])yuvconstants->kYToRgb;
  auVar3 = *(undefined1 (*) [16])yuvconstants->kYBiasToRgb;
  do {
    uVar1 = *(ulong *)y_buf;
    y_buf = (uint8_t *)((long)y_buf + 8);
    uVar37 = (undefined1)(uVar1 >> 0x38);
    auVar30._8_6_ = 0;
    auVar30._0_8_ = uVar1;
    auVar30[0xe] = uVar37;
    auVar30[0xf] = uVar37;
    uVar37 = (undefined1)(uVar1 >> 0x30);
    auVar29._14_2_ = auVar30._14_2_;
    auVar29._8_5_ = 0;
    auVar29._0_8_ = uVar1;
    auVar29[0xd] = uVar37;
    auVar28._13_3_ = auVar29._13_3_;
    auVar28._8_4_ = 0;
    auVar28._0_8_ = uVar1;
    auVar28[0xc] = uVar37;
    uVar37 = (undefined1)(uVar1 >> 0x28);
    auVar27._12_4_ = auVar28._12_4_;
    auVar27._8_3_ = 0;
    auVar27._0_8_ = uVar1;
    auVar27[0xb] = uVar37;
    auVar26._11_5_ = auVar27._11_5_;
    auVar26._8_2_ = 0;
    auVar26._0_8_ = uVar1;
    auVar26[10] = uVar37;
    uVar37 = (undefined1)(uVar1 >> 0x20);
    auVar25._10_6_ = auVar26._10_6_;
    auVar25[8] = 0;
    auVar25._0_8_ = uVar1;
    auVar25[9] = uVar37;
    auVar24._9_7_ = auVar25._9_7_;
    auVar24[8] = uVar37;
    auVar24._0_8_ = uVar1;
    uVar37 = (undefined1)(uVar1 >> 0x18);
    auVar23._8_8_ = auVar24._8_8_;
    auVar23[7] = uVar37;
    auVar23[6] = uVar37;
    uVar37 = (undefined1)(uVar1 >> 0x10);
    auVar23[5] = uVar37;
    auVar23[4] = uVar37;
    uVar37 = (undefined1)(uVar1 >> 8);
    auVar23[3] = uVar37;
    auVar23[2] = uVar37;
    auVar23[0] = (undefined1)uVar1;
    auVar23[1] = auVar23[0];
    auVar31 = pmulhuw(auVar23,auVar2);
    auVar31 = paddsw(auVar31,auVar3);
    auVar31 = psraw(auVar31,6);
    sVar13 = auVar31._0_2_;
    cVar5 = (0 < sVar13) * (sVar13 < 0x100) * auVar31[0] - (0xff < sVar13);
    sVar13 = auVar31._2_2_;
    cVar6 = (0 < sVar13) * (sVar13 < 0x100) * auVar31[2] - (0xff < sVar13);
    sVar13 = auVar31._4_2_;
    cVar7 = (0 < sVar13) * (sVar13 < 0x100) * auVar31[4] - (0xff < sVar13);
    sVar13 = auVar31._6_2_;
    cVar8 = (0 < sVar13) * (sVar13 < 0x100) * auVar31[6] - (0xff < sVar13);
    sVar13 = auVar31._8_2_;
    cVar9 = (0 < sVar13) * (sVar13 < 0x100) * auVar31[8] - (0xff < sVar13);
    sVar13 = auVar31._10_2_;
    cVar10 = (0 < sVar13) * (sVar13 < 0x100) * auVar31[10] - (0xff < sVar13);
    sVar13 = auVar31._12_2_;
    cVar11 = (0 < sVar13) * (sVar13 < 0x100) * auVar31[0xc] - (0xff < sVar13);
    sVar13 = auVar31._14_2_;
    cVar12 = (0 < sVar13) * (sVar13 < 0x100) * auVar31[0xe] - (0xff < sVar13);
    uVar21 = CONCAT11(cVar12,cVar12);
    uVar20 = CONCAT31(CONCAT21(uVar21,cVar11),cVar11);
    uVar19 = CONCAT51(CONCAT41(uVar20,cVar10),cVar10);
    Var18 = CONCAT72(CONCAT61(uVar19,cVar9),CONCAT11(cVar9,cVar12));
    Var17 = CONCAT91(CONCAT81((long)((unkuint9)Var18 >> 8),cVar8),cVar8);
    auVar16._2_10_ = Var17;
    auVar16[1] = cVar7;
    auVar16[0] = cVar7;
    auVar15._2_12_ = auVar16;
    auVar15[1] = cVar6;
    auVar15[0] = cVar6;
    auVar32._0_2_ = CONCAT11(cVar5,cVar5);
    auVar32._2_14_ = auVar15;
    uVar38 = (undefined2)Var17;
    auVar36._0_12_ = auVar32._0_12_;
    auVar36._12_2_ = uVar38;
    auVar36._14_2_ = uVar38;
    auVar35._12_4_ = auVar36._12_4_;
    auVar35._0_10_ = auVar32._0_10_;
    auVar35._10_2_ = auVar16._0_2_;
    auVar34._10_6_ = auVar35._10_6_;
    auVar34._0_8_ = auVar32._0_8_;
    auVar34._8_2_ = auVar16._0_2_;
    auVar33._8_8_ = auVar34._8_8_;
    auVar33._6_2_ = auVar15._0_2_;
    auVar33._4_2_ = auVar15._0_2_;
    auVar33._2_2_ = auVar32._0_2_;
    auVar33._0_2_ = auVar32._0_2_;
    uVar38 = (undefined2)((unkuint9)Var18 >> 8);
    auVar39._2_2_ = uVar38;
    auVar39._0_2_ = uVar38;
    uVar38 = (undefined2)uVar19;
    auVar39._4_2_ = uVar38;
    auVar39._6_2_ = uVar38;
    uVar38 = (undefined2)uVar20;
    auVar39._8_2_ = uVar38;
    auVar39._10_2_ = uVar38;
    auVar39._12_2_ = uVar21;
    auVar39._14_2_ = uVar21;
    auVar31[0xb] = 0xff;
    auVar31._0_11_ = ZEXT811(0xff000000ff000000);
    auVar31._12_3_ = 0;
    auVar31[0xf] = 0xff;
    auVar14[0xb] = 0xff;
    auVar14._0_11_ = ZEXT811(0xff000000ff000000);
    auVar14._12_3_ = 0;
    auVar14[0xf] = 0xff;
    *(undefined1 (*) [16])dst_argb = auVar33 | auVar31;
    *(undefined1 (*) [16])((long)dst_argb + 0x10) = auVar39 | auVar14;
    dst_argb = (uint8_t *)((long)dst_argb + 0x20);
    iVar22 = width + -8;
    bVar4 = 7 < width;
    width = iVar22;
  } while (iVar22 != 0 && bVar4);
  return;
}

Assistant:

void I400ToARGBRow_SSE2(const uint8_t* y_buf,
                        uint8_t* dst_argb,
                        const struct YuvConstants* yuvconstants,
                        int width) {
  asm volatile(
      "movdqa      192(%3),%%xmm2                \n"  // yg = 18997 = 1.164
      "movdqa      224(%3),%%xmm3                \n"  // ygb = 1160 = 1.164 * 16
      "pcmpeqb     %%xmm4,%%xmm4                 \n"  // 0xff000000
      "pslld       $0x18,%%xmm4                  \n"

      LABELALIGN
      "1:                                        \n"
      // Step 1: Scale Y contribution to 8 G values. G = (y - 16) * 1.164
      "movq      (%0),%%xmm0                     \n"
      "lea       0x8(%0),%0                      \n"
      "punpcklbw %%xmm0,%%xmm0                   \n"
      "pmulhuw   %%xmm2,%%xmm0                   \n"
      "paddsw    %%xmm3,%%xmm0                   \n"
      "psraw     $6, %%xmm0                      \n"
      "packuswb  %%xmm0,%%xmm0                   \n"

      // Step 2: Weave into ARGB
      "punpcklbw %%xmm0,%%xmm0                   \n"
      "movdqa    %%xmm0,%%xmm1                   \n"
      "punpcklwd %%xmm0,%%xmm0                   \n"
      "punpckhwd %%xmm1,%%xmm1                   \n"
      "por       %%xmm4,%%xmm0                   \n"
      "por       %%xmm4,%%xmm1                   \n"
      "movdqu    %%xmm0,(%1)                     \n"
      "movdqu    %%xmm1,0x10(%1)                 \n"
      "lea       0x20(%1),%1                     \n"

      "sub       $0x8,%2                         \n"
      "jg        1b                              \n"
      : "+r"(y_buf),       // %0
        "+r"(dst_argb),    // %1
        "+rm"(width)       // %2
      : "r"(yuvconstants)  // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4");
}